

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend.cpp
# Opt level: O2

void __thiscall backend::Backend::show_passes(Backend *this,ostream *o)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  ostream *poVar4;
  unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *pass;
  pointer puVar5;
  pointer puVar6;
  string local_50;
  
  puVar1 = (this->mir_passes).
           super__Vector_base<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>,_std::allocator<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (this->mir_passes).
                super__Vector_base<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>,_std::allocator<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    (**((puVar5->_M_t).
        super___uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
        ._M_t.
        super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
        .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl)->
       _vptr_MirOptimizePass)(&local_50);
    bVar3 = should_run_pass(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar3) {
      poVar4 = std::operator<<(o," Run: ");
      (**((puVar5->_M_t).
          super___uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
          ._M_t.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl)->
         _vptr_MirOptimizePass)(&local_50);
      poVar4 = std::operator<<(poVar4,(string *)&local_50);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      poVar4 = std::operator<<(o,"Skip: ");
      (**((puVar5->_M_t).
          super___uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
          ._M_t.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl)->
         _vptr_MirOptimizePass)(&local_50);
      poVar4 = std::operator<<(poVar4,(string *)&local_50);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  poVar4 = std::operator<<(o," Run: mir_to_arm");
  std::endl<char,std::char_traits<char>>(poVar4);
  puVar2 = (this->arm_passes).
           super__Vector_base<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>,_std::allocator<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (this->arm_passes).
                super__Vector_base<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>,_std::allocator<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar2; puVar6 = puVar6 + 1) {
    (**((puVar6->_M_t).
        super___uniq_ptr_impl<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>
        ._M_t.
        super__Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>
        .super__Head_base<0UL,_backend::ArmOptimizePass_*,_false>._M_head_impl)->
       _vptr_ArmOptimizePass)(&local_50);
    bVar3 = should_run_pass(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar3) {
      poVar4 = std::operator<<(o," Run: ");
      (**((puVar6->_M_t).
          super___uniq_ptr_impl<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>
          ._M_t.
          super__Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>
          .super__Head_base<0UL,_backend::ArmOptimizePass_*,_false>._M_head_impl)->
         _vptr_ArmOptimizePass)(&local_50);
      poVar4 = std::operator<<(poVar4,(string *)&local_50);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      poVar4 = std::operator<<(o,"Skip: ");
      (**((puVar6->_M_t).
          super___uniq_ptr_impl<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>
          ._M_t.
          super__Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>
          .super__Head_base<0UL,_backend::ArmOptimizePass_*,_false>._M_head_impl)->
         _vptr_ArmOptimizePass)(&local_50);
      poVar4 = std::operator<<(poVar4,(string *)&local_50);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void Backend::show_passes(std::ostream& o) {
  for (auto& pass : mir_passes) {
    if (!should_run_pass(pass->pass_name())) {
      o << "Skip: " << pass->pass_name() << std::endl;
    } else {
      o << " Run: " << pass->pass_name() << std::endl;
    }
  }
  o << " Run: mir_to_arm" << std::endl;
  for (auto& pass : arm_passes) {
    if (!should_run_pass(pass->pass_name())) {
      o << "Skip: " << pass->pass_name() << std::endl;
    } else {
      o << " Run: " << pass->pass_name() << std::endl;
    }
  }
}